

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

int gej_xyz_equals_gej(secp256k1_gej *a,secp256k1_gej *b)

{
  secp256k1_fe *r;
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint uVar4;
  int iVar5;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int iVar6;
  undefined8 extraout_RAX;
  secp256k1_scratch_space *scratch;
  long lVar7;
  secp256k1_scalar *psVar8;
  long lVar9;
  ulong uVar10;
  long extraout_RDX;
  secp256k1_gej *scratch_00;
  size_t len;
  long extraout_RDX_00;
  secp256k1_gej *r_00;
  secp256k1_ge *r_01;
  secp256k1_ge *psVar11;
  secp256k1_strauss_point_state *psVar12;
  uchar *out32;
  secp256k1_ge *psVar13;
  ulong uVar14;
  secp256k1_gej *psVar15;
  secp256k1_gej *psVar16;
  secp256k1_gej *psVar17;
  ulong uVar18;
  ulong uVar19;
  secp256k1_ge *a_00;
  secp256k1_sha256 *hash;
  secp256k1_strauss_point_state *psVar20;
  uint64_t *puVar21;
  ulong uVar22;
  code *cb;
  secp256k1_scalar **cbdata;
  secp256k1_scalar **ppsVar23;
  secp256k1_ge *psVar24;
  secp256k1_sha256 *acc;
  secp256k1_callback *error_callback;
  secp256k1_ge *r_02;
  secp256k1_ge *a_01;
  secp256k1_ge *r_03;
  secp256k1_scalar *psVar25;
  secp256k1_ge *r_04;
  secp256k1_ge *a_02;
  long lVar26;
  bool bVar27;
  byte bVar28;
  secp256k1_gej b2;
  secp256k1_gej a2;
  size_t sStack_3e28;
  secp256k1_scalar *psStack_3e08;
  secp256k1_ge *psStack_3e00;
  ulong uStack_3df8;
  ulong uStack_3df0;
  ulong uStack_3de8;
  ulong uStack_3de0;
  ulong uStack_3dd8;
  ulong uStack_3dd0;
  secp256k1_scalar sStack_3dc8;
  secp256k1_scalar sStack_3da8;
  secp256k1_strauss_state sStack_3d88;
  secp256k1_gej sStack_3d70;
  undefined1 auStack_3cd8 [152];
  secp256k1_gej sStack_3c40;
  secp256k1_gej sStack_3ba8;
  secp256k1_scalar sStack_3b10;
  secp256k1_scalar sStack_3af0;
  secp256k1_scalar sStack_3ad0;
  secp256k1_scalar sStack_3ab0;
  secp256k1_scalar asStack_3a90 [28];
  secp256k1_gej sStack_3710;
  secp256k1_scalar sStack_3678;
  secp256k1_scalar sStack_3658;
  secp256k1_gej sStack_3638;
  secp256k1_fe asStack_35a0 [8];
  secp256k1_ge asStack_3420 [8];
  secp256k1_ge sStack_30d8;
  secp256k1_strauss_point_state sStack_3070;
  secp256k1_ge sStack_2c60;
  secp256k1_ge asStack_2bf8 [31];
  secp256k1_gej *psStack_1f58;
  secp256k1_callback *psStack_1f50;
  secp256k1_gej *psStack_1f40;
  secp256k1_strauss_point_state *psStack_1f38;
  secp256k1_scalar *psStack_1f30;
  secp256k1_gej *psStack_1f28;
  undefined1 auStack_1f10 [8];
  undefined1 auStack_1f08 [176];
  secp256k1_gej sStack_1e58;
  secp256k1_gej sStack_1dc0;
  secp256k1_gej sStack_1d28;
  secp256k1_gej sStack_1c90;
  secp256k1_gej sStack_1bf8;
  secp256k1_gej asStack_1b60 [2];
  secp256k1_gej asStack_19e0 [5];
  secp256k1_strauss_point_state sStack_16a0;
  secp256k1_scratch_space *psStack_1288;
  secp256k1_sha256 *psStack_1280;
  undefined1 *puStack_1278;
  secp256k1_gej *psStack_1270;
  secp256k1_gej *psStack_1268;
  code *pcStack_1260;
  undefined4 uStack_124e;
  undefined2 uStack_124a;
  secp256k1_gej *psStack_1248;
  long lStack_1240;
  undefined1 auStack_1238 [40];
  undefined8 uStack_1210;
  uint64_t uStack_1208;
  uint64_t uStack_1200;
  secp256k1_sha256 sStack_11f8;
  secp256k1_sha256 sStack_1188;
  secp256k1_gej *psStack_1120;
  secp256k1_ge *psStack_1118;
  secp256k1_ge *psStack_1110;
  secp256k1_ge *psStack_1108;
  secp256k1_gej *psStack_1100;
  secp256k1_strauss_point_state *psStack_10f8;
  undefined1 auStack_10f0 [32];
  undefined1 auStack_10d0 [40];
  secp256k1_ge *psStack_10a8;
  secp256k1_strauss_point_state *psStack_10a0;
  secp256k1_gej sStack_1098;
  secp256k1_gej sStack_1000;
  secp256k1_gej sStack_f68;
  secp256k1_ge sStack_ed0;
  secp256k1_gej sStack_e68;
  secp256k1_ge asStack_dd0 [3];
  secp256k1_ge asStack_c50 [8];
  secp256k1_strauss_point_state sStack_910;
  secp256k1_ge *psStack_4f8;
  secp256k1_ge *psStack_4f0;
  secp256k1_ge *psStack_4e8;
  secp256k1_ge *psStack_4e0;
  secp256k1_ge *psStack_4d8;
  secp256k1_ge *psStack_4d0;
  code *pcStack_4c8;
  uint uStack_4b4;
  undefined1 auStack_4b0 [56];
  ulong uStack_478;
  ulong uStack_470;
  ulong uStack_468;
  ulong uStack_460;
  ulong uStack_458;
  undefined1 auStack_450 [72];
  uint64_t uStack_408;
  uint64_t uStack_400;
  uint64_t uStack_3f8;
  ulong uStack_3f0;
  ulong uStack_3e8;
  secp256k1_ge *psStack_3d8;
  secp256k1_ge *psStack_3d0;
  uint64_t uStack_3c8;
  uint64_t uStack_3c0;
  uint64_t uStack_3b8;
  uint64_t uStack_3b0;
  uint64_t uStack_3a8;
  uint64_t uStack_3a0;
  uint64_t uStack_398;
  uint64_t uStack_390;
  uint64_t uStack_388;
  undefined1 auStack_380 [56];
  uint64_t uStack_348;
  uint64_t uStack_340;
  uint64_t uStack_338;
  secp256k1_ge *psStack_330;
  uint uStack_328;
  secp256k1_ge sStack_310;
  secp256k1_ge sStack_2a0;
  secp256k1_gej sStack_230;
  secp256k1_fe *psStack_198;
  secp256k1_ge *psStack_190;
  secp256k1_ge *psStack_188;
  secp256k1_ge *psStack_180;
  secp256k1_ge *psStack_178;
  secp256k1_ge *psStack_170;
  undefined1 local_160 [92];
  int local_104;
  undefined1 local_100 [100];
  int local_9c;
  secp256k1_ge local_98;
  
  bVar28 = 0;
  iVar5 = 0;
  if ((a->infinity != b->infinity) || (iVar5 = 1, a->infinity != 0)) {
    return iVar5;
  }
  r_02 = (secp256k1_ge *)(local_100 + 0x38);
  psStack_170 = (secp256k1_ge *)0x1555de;
  memcpy(r_02,a,0x98);
  psVar11 = (secp256k1_ge *)local_160;
  psStack_170 = (secp256k1_ge *)0x1555f3;
  memcpy(psVar11,b,0x98);
  psStack_170 = (secp256k1_ge *)0x1555fb;
  secp256k1_fe_normalize((secp256k1_fe *)r_02);
  r_04 = &local_98;
  psStack_170 = (secp256k1_ge *)0x15560b;
  secp256k1_fe_normalize(&r_04->x);
  r = &local_98.y;
  psStack_170 = (secp256k1_ge *)0x15561b;
  secp256k1_fe_normalize(r);
  psStack_170 = (secp256k1_ge *)0x155623;
  secp256k1_fe_normalize((secp256k1_fe *)psVar11);
  psVar24 = (secp256k1_ge *)(local_160 + 0x30);
  psStack_170 = (secp256k1_ge *)0x155630;
  secp256k1_fe_normalize((secp256k1_fe *)psVar24);
  r_03 = (secp256k1_ge *)local_100;
  psStack_170 = (secp256k1_ge *)0x15563d;
  secp256k1_fe_normalize((secp256k1_fe *)r_03);
  psStack_170 = (secp256k1_ge *)0x155645;
  secp256k1_fe_verify((secp256k1_fe *)r_02);
  psStack_170 = (secp256k1_ge *)0x15564d;
  psVar13 = psVar11;
  secp256k1_fe_verify((secp256k1_fe *)psVar11);
  if (local_9c == 0) {
    psStack_170 = (secp256k1_ge *)0x155752;
    gej_xyz_equals_gej_cold_6();
LAB_00155752:
    psStack_170 = (secp256k1_ge *)0x155757;
    gej_xyz_equals_gej_cold_5();
LAB_00155757:
    psStack_170 = (secp256k1_ge *)0x15575c;
    gej_xyz_equals_gej_cold_4();
LAB_0015575c:
    psStack_170 = (secp256k1_ge *)0x155761;
    gej_xyz_equals_gej_cold_3();
LAB_00155761:
    psStack_170 = (secp256k1_ge *)0x155766;
    gej_xyz_equals_gej_cold_2();
  }
  else {
    if (local_160._44_4_ == 0) goto LAB_00155752;
    uVar4 = 4;
    do {
      uVar18 = *(ulong *)(local_160 + (ulong)uVar4 * 8);
      uVar10 = *(ulong *)(local_100 + (ulong)uVar4 * 8 + 0x38);
      if (uVar10 >= uVar18 && uVar10 != uVar18) {
        psVar11 = (secp256k1_ge *)0x1;
        goto LAB_0015568f;
      }
      if (uVar10 < uVar18) {
        psVar11 = (secp256k1_ge *)0xffffffff;
        goto LAB_0015568f;
      }
      bVar27 = uVar4 != 0;
      uVar4 = uVar4 - 1;
    } while (bVar27);
    psVar11 = (secp256k1_ge *)0x0;
LAB_0015568f:
    psStack_170 = (secp256k1_ge *)0x155697;
    secp256k1_fe_verify(&r_04->x);
    psStack_170 = (secp256k1_ge *)0x15569f;
    psVar13 = psVar24;
    secp256k1_fe_verify((secp256k1_fe *)psVar24);
    if (local_98.x.normalized == 0) goto LAB_00155757;
    if (local_104 == 0) goto LAB_0015575c;
    uVar4 = 4;
    do {
      uVar18 = *(ulong *)(local_160 + (ulong)uVar4 * 8 + 0x30);
      uVar10 = local_98.x.n[uVar4];
      if (uVar10 >= uVar18 && uVar10 != uVar18) {
        r_04 = (secp256k1_ge *)0x1;
        goto LAB_001556e8;
      }
      if (uVar10 < uVar18) {
        r_04 = (secp256k1_ge *)0xffffffff;
        goto LAB_001556e8;
      }
      bVar27 = uVar4 != 0;
      uVar4 = uVar4 - 1;
    } while (bVar27);
    r_04 = (secp256k1_ge *)0x0;
LAB_001556e8:
    psStack_170 = (secp256k1_ge *)0x1556f0;
    secp256k1_fe_verify(r);
    psStack_170 = (secp256k1_ge *)0x1556f8;
    psVar13 = r_03;
    secp256k1_fe_verify((secp256k1_fe *)r_03);
    if (local_98.y.normalized == 0) goto LAB_00155761;
    if (local_100._44_4_ != 0) {
      uVar4 = 4;
      do {
        if (local_98.y.n[uVar4] != *(uint64_t *)(local_100 + (ulong)uVar4 * 8)) {
          bVar27 = true;
          goto LAB_00155733;
        }
        bVar27 = uVar4 != 0;
        uVar4 = uVar4 - 1;
      } while (bVar27);
      bVar27 = false;
LAB_00155733:
      return (uint)(((int)r_04 == 0 && (int)psVar11 == 0) && !bVar27);
    }
  }
  psStack_170 = (secp256k1_ge *)test_pre_g_table;
  gej_xyz_equals_gej_cold_1();
  r_01 = &sStack_310;
  pcStack_4c8 = (code *)0x155797;
  psStack_3d8 = psVar13;
  psStack_198 = r;
  psStack_190 = psVar24;
  psStack_188 = r_02;
  psStack_180 = r_03;
  psStack_178 = r_04;
  psStack_170 = psVar11;
  secp256k1_ge_from_storage(r_01,(secp256k1_ge_storage *)psVar13);
  pcStack_4c8 = (code *)0x15579f;
  a_00 = r_01;
  iVar5 = secp256k1_ge_is_valid_var(r_01);
  if (iVar5 != 0) {
    pcStack_4c8 = (code *)0x1557d6;
    secp256k1_gej_set_ge(&sStack_230,&sStack_310);
    pcStack_4c8 = (code *)0x1557e3;
    secp256k1_gej_double_var(&sStack_230,&sStack_230,(secp256k1_fe *)0x0);
    pcStack_4c8 = (code *)0x1557f3;
    secp256k1_ge_set_gej_var((secp256k1_ge *)auStack_380,&sStack_230);
    r_01 = (secp256k1_ge *)0x40;
    uStack_4b4 = auStack_380._40_4_;
    while( true ) {
      uVar4 = uStack_4b4;
      a_01 = (secp256k1_ge *)(ulong)uStack_4b4;
      a_02 = (secp256k1_ge *)0x3fffffffffffc;
      psVar11 = (secp256k1_ge *)0xffffffffffff;
      pcStack_4c8 = (code *)0x155811;
      secp256k1_fe_verify(&sStack_310.x);
      psVar13 = (secp256k1_ge *)0x1;
      pcStack_4c8 = (code *)0x15581e;
      secp256k1_fe_verify_magnitude(&sStack_310.x,1);
      auStack_4b0._48_8_ = 0x3ffffbfffff0bc - sStack_310.x.n[0];
      uStack_478 = 0x3ffffffffffffc - sStack_310.x.n[1];
      uStack_470 = 0x3ffffffffffffc - sStack_310.x.n[2];
      uStack_468 = 0x3ffffffffffffc - sStack_310.x.n[3];
      uStack_460 = 0x3fffffffffffc - sStack_310.x.n[4];
      uStack_458._0_4_ = 2;
      uStack_458._4_4_ = 0;
      r_02 = (secp256k1_ge *)(auStack_4b0 + 0x30);
      pcStack_4c8 = (code *)0x155872;
      secp256k1_fe_verify((secp256k1_fe *)r_02);
      pcStack_4c8 = (code *)0x15587a;
      secp256k1_fe_verify((secp256k1_fe *)r_02);
      a_00 = (secp256k1_ge *)auStack_380;
      pcStack_4c8 = (code *)0x155887;
      secp256k1_fe_verify((secp256k1_fe *)a_00);
      if (0x20 < (int)((int)uStack_458 + uVar4)) break;
      uStack_3a0 = auStack_380._0_8_;
      uStack_398 = auStack_380._8_8_;
      auStack_4b0._48_8_ = auStack_4b0._48_8_ + auStack_380._0_8_;
      uStack_478 = uStack_478 + auStack_380._8_8_;
      uStack_390 = auStack_380._16_8_;
      uStack_388 = auStack_380._24_8_;
      uStack_470 = uStack_470 + auStack_380._16_8_;
      uStack_468 = uStack_468 + auStack_380._24_8_;
      uStack_3c8 = auStack_380._32_8_;
      uStack_460 = uStack_460 + auStack_380._32_8_;
      uStack_458 = (ulong)((int)uStack_458 + uVar4);
      pcStack_4c8 = (code *)0x15590c;
      auStack_450._56_8_ = r_01;
      secp256k1_fe_verify((secp256k1_fe *)r_02);
      pcStack_4c8 = (code *)0x155914;
      secp256k1_fe_verify((secp256k1_fe *)r_02);
      auStack_4b0._48_8_ = (uStack_460 >> 0x30) * 0x1000003d1 + auStack_4b0._48_8_;
      uStack_478 = ((ulong)auStack_4b0._48_8_ >> 0x34) + uStack_478;
      uStack_470 = (uStack_478 >> 0x34) + uStack_470;
      uVar18 = (uStack_470 >> 0x34) + uStack_468;
      psVar24 = (secp256k1_ge *)0xfffffffffffff;
      uStack_468 = uVar18 & 0xfffffffffffff;
      uStack_460 = (uVar18 >> 0x34) + (uStack_460 & 0xffffffffffff);
      uStack_470 = uStack_470 & 0xfffffffffffff;
      uStack_478 = uStack_478 & 0xfffffffffffff;
      auStack_4b0._48_8_ = auStack_4b0._48_8_ & 0xfffffffffffff;
      uStack_458 = CONCAT44(uStack_458._4_4_,1);
      pcStack_4c8 = (code *)0x1559a3;
      secp256k1_fe_verify((secp256k1_fe *)r_02);
      pcStack_4c8 = (code *)0x1559b3;
      secp256k1_fe_verify(&sStack_310.y);
      psVar13 = (secp256k1_ge *)0x1;
      pcStack_4c8 = (code *)0x1559c0;
      secp256k1_fe_verify_magnitude(&sStack_310.y,1);
      auStack_4b0._0_8_ = 0x3ffffbfffff0bc - sStack_310.y.n[0];
      auStack_4b0._8_8_ = 0x3ffffffffffffc - sStack_310.y.n[1];
      auStack_4b0._16_8_ = 0x3ffffffffffffc - sStack_310.y.n[2];
      auStack_4b0._24_8_ = 0x3ffffffffffffc - sStack_310.y.n[3];
      auStack_4b0._32_8_ = 0x3fffffffffffc - sStack_310.y.n[4];
      auStack_4b0._40_4_ = 2;
      auStack_4b0._44_4_ = 0;
      a_01 = (secp256k1_ge *)auStack_4b0;
      pcStack_4c8 = (code *)0x155a14;
      secp256k1_fe_verify((secp256k1_fe *)a_01);
      pcStack_4c8 = (code *)0x155a1c;
      secp256k1_fe_verify((secp256k1_fe *)a_01);
      a_00 = (secp256k1_ge *)(auStack_380 + 0x30);
      pcStack_4c8 = (code *)0x155a29;
      secp256k1_fe_verify((secp256k1_fe *)a_00);
      uVar4 = uStack_328;
      r_01 = (secp256k1_ge *)(ulong)uStack_328;
      if (0x20 < (int)(auStack_4b0._40_4_ + uStack_328)) goto LAB_00156126;
      uStack_3c0 = auStack_380._48_8_;
      uStack_3b8 = uStack_348;
      auStack_4b0._0_8_ = auStack_4b0._0_8_ + auStack_380._48_8_;
      auStack_4b0._8_8_ = auStack_4b0._8_8_ + uStack_348;
      uStack_3b0 = uStack_340;
      uStack_3a8 = uStack_338;
      auStack_4b0._16_8_ = auStack_4b0._16_8_ + uStack_340;
      auStack_4b0._24_8_ = auStack_4b0._24_8_ + uStack_338;
      psStack_3d0 = psStack_330;
      auStack_4b0._32_8_ = (long)(psStack_330->x).n + auStack_4b0._32_8_;
      auStack_4b0._44_4_ = 0;
      auStack_4b0._40_4_ = auStack_4b0._40_4_ + uStack_328;
      pcStack_4c8 = (code *)0x155aac;
      secp256k1_fe_verify((secp256k1_fe *)a_01);
      pcStack_4c8 = (code *)0x155ab4;
      secp256k1_fe_verify((secp256k1_fe *)a_01);
      a_02 = (secp256k1_ge *)0x1000003d1;
      auStack_4b0._0_8_ = ((ulong)auStack_4b0._32_8_ >> 0x30) * 0x1000003d1 + auStack_4b0._0_8_;
      auStack_4b0._8_8_ = ((ulong)auStack_4b0._0_8_ >> 0x34) + auStack_4b0._8_8_;
      auStack_4b0._16_8_ = ((ulong)auStack_4b0._8_8_ >> 0x34) + auStack_4b0._16_8_;
      uVar18 = ((ulong)auStack_4b0._16_8_ >> 0x34) + auStack_4b0._24_8_;
      auStack_4b0._24_8_ = uVar18 & 0xfffffffffffff;
      auStack_4b0._32_8_ = (uVar18 >> 0x34) + (auStack_4b0._32_8_ & 0xffffffffffff);
      auStack_4b0._16_8_ = auStack_4b0._16_8_ & 0xfffffffffffff;
      auStack_4b0._8_8_ = auStack_4b0._8_8_ & 0xfffffffffffff;
      auStack_4b0._0_8_ = auStack_4b0._0_8_ & 0xfffffffffffff;
      auStack_4b0._40_4_ = 1;
      pcStack_4c8 = (code *)0x155b39;
      secp256k1_fe_verify((secp256k1_fe *)a_01);
      pcStack_4c8 = (code *)0x155b41;
      secp256k1_fe_verify((secp256k1_fe *)r_02);
      uVar18 = (uStack_460 >> 0x30) * 0x1000003d1 + auStack_4b0._48_8_;
      r_02 = (secp256k1_ge *)0xffffefffffc2f;
      if (((uVar18 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar18 & 0xfffffffffffff) == 0)) {
        uVar10 = (uVar18 >> 0x34) + uStack_478;
        uVar14 = (uVar10 >> 0x34) + uStack_470;
        uVar19 = (uVar14 >> 0x34) + uStack_468;
        uVar22 = (uVar19 >> 0x34) + (uStack_460 & 0xffffffffffff);
        if ((((uVar10 | uVar18 | uVar14 | uVar19) & 0xfffffffffffff) != 0 || uVar22 != 0) &&
           ((uVar18 + 0x1000003d0 & uVar10 & uVar14 & uVar19 & (uVar22 ^ 0xf000000000000)) !=
            0xfffffffffffff)) goto LAB_00155ccb;
        pcStack_4c8 = (code *)0x155c09;
        secp256k1_fe_verify((secp256k1_fe *)auStack_4b0);
        uVar18 = ((ulong)auStack_4b0._32_8_ >> 0x30) * 0x1000003d1 + auStack_4b0._0_8_;
        if (((uVar18 & 0xfffffffffffff) != 0xffffefffffc2f) && ((uVar18 & 0xfffffffffffff) != 0))
        goto LAB_00155ccb;
        uVar10 = (uVar18 >> 0x34) + auStack_4b0._8_8_;
        psVar13 = (secp256k1_ge *)((uVar10 >> 0x34) + auStack_4b0._16_8_);
        a_00 = (secp256k1_ge *)(((ulong)psVar13 >> 0x34) + auStack_4b0._24_8_);
        uVar14 = ((ulong)a_00 >> 0x34) + (auStack_4b0._32_8_ & 0xffffffffffff);
        r_03 = a_01;
        r_04 = a_02;
        if ((((uVar10 | uVar18 | (ulong)psVar13 | (ulong)a_00) & 0xfffffffffffff) != 0 ||
             uVar14 != 0) &&
           ((uVar18 + 0x1000003d0 & uVar10 & (ulong)psVar13 & (ulong)a_00 &
            (uVar14 ^ 0xf000000000000)) != 0xfffffffffffff)) goto LAB_00155ccb;
        goto LAB_00156144;
      }
LAB_00155ccb:
      psVar13 = (secp256k1_ge *)
                ((long)(psStack_3d8->x).n + (long)((secp256k1_fe *)auStack_450._56_8_)->n);
      psVar24 = &sStack_2a0;
      pcStack_4c8 = (code *)0x155cef;
      secp256k1_ge_from_storage(psVar24,(secp256k1_ge_storage *)psVar13);
      pcStack_4c8 = (code *)0x155cf7;
      a_00 = psVar24;
      iVar5 = secp256k1_ge_is_valid_var(psVar24);
      if (iVar5 == 0) goto LAB_0015612b;
      pcStack_4c8 = (code *)0x155d07;
      secp256k1_fe_verify(&psVar24->x);
      psVar13 = (secp256k1_ge *)0x1;
      pcStack_4c8 = (code *)0x155d14;
      secp256k1_fe_verify_magnitude(&psVar24->x,1);
      auStack_450._0_8_ = 0x3ffffbfffff0bc - sStack_2a0.x.n[0];
      auStack_450._8_8_ = 0x3ffffffffffffc - sStack_2a0.x.n[1];
      auStack_450._16_8_ = 0x3ffffffffffffc - sStack_2a0.x.n[2];
      auStack_450._24_8_ = 0x3ffffffffffffc - sStack_2a0.x.n[3];
      auStack_450._32_8_ = 0x3fffffffffffc - sStack_2a0.x.n[4];
      auStack_450._40_8_ = 2;
      psVar11 = (secp256k1_ge *)auStack_450;
      pcStack_4c8 = (code *)0x155d78;
      secp256k1_fe_verify((secp256k1_fe *)psVar11);
      pcStack_4c8 = (code *)0x155d80;
      secp256k1_fe_verify((secp256k1_fe *)psVar11);
      a_00 = (secp256k1_ge *)auStack_380;
      pcStack_4c8 = (code *)0x155d8d;
      secp256k1_fe_verify((secp256k1_fe *)a_00);
      r_03 = psStack_3d0;
      if (0x20 < (int)(auStack_450._40_4_ + uStack_4b4)) goto LAB_00156130;
      psVar24 = (secp256k1_ge *)0xffffefffffc2f;
      r_02 = (secp256k1_ge *)0x1000003d1;
      auStack_450._0_8_ = uStack_3a0 + auStack_450._0_8_;
      auStack_450._8_8_ = uStack_398 + auStack_450._8_8_;
      auStack_450._16_8_ = uStack_390 + auStack_450._16_8_;
      auStack_450._24_8_ = uStack_388 + auStack_450._24_8_;
      auStack_450._32_8_ = auStack_450._32_8_ + uStack_3c8;
      auStack_450._44_4_ = 0;
      auStack_450._40_4_ = auStack_450._40_4_ + uStack_4b4;
      pcStack_4c8 = (code *)0x155e0b;
      secp256k1_fe_verify((secp256k1_fe *)psVar11);
      uStack_3f0 = sStack_2a0.y.n[4];
      uStack_3e8._0_4_ = sStack_2a0.y.magnitude;
      uStack_3e8._4_4_ = sStack_2a0.y.normalized;
      uStack_400 = sStack_2a0.y.n[2];
      uStack_3f8 = sStack_2a0.y.n[3];
      auStack_450._64_8_ = sStack_2a0.y.n[0];
      uStack_408 = sStack_2a0.y.n[1];
      r_04 = (secp256k1_ge *)(auStack_450 + 0x40);
      pcStack_4c8 = (code *)0x155e46;
      secp256k1_fe_verify((secp256k1_fe *)r_04);
      a_00 = (secp256k1_ge *)(auStack_380 + 0x30);
      pcStack_4c8 = (code *)0x155e53;
      secp256k1_fe_verify((secp256k1_fe *)a_00);
      uVar4 = uVar4 + (int)uStack_3e8;
      r_01 = (secp256k1_ge *)(ulong)uVar4;
      a_01 = r_03;
      a_02 = r_04;
      if (0x20 < (int)uVar4) goto LAB_00156135;
      auStack_450._64_8_ = uStack_3c0 + auStack_450._64_8_;
      uStack_408 = uStack_3b8 + uStack_408;
      uStack_400 = uStack_3b0 + uStack_400;
      uStack_3f8 = uStack_3a8 + uStack_3f8;
      uStack_3f0 = (long)(r_03->x).n + uStack_3f0;
      uStack_3e8 = (ulong)uVar4;
      pcStack_4c8 = (code *)0x155ebb;
      secp256k1_fe_verify((secp256k1_fe *)r_04);
      pcStack_4c8 = (code *)0x155ec3;
      secp256k1_fe_verify((secp256k1_fe *)psVar11);
      uVar18 = ((ulong)auStack_450._32_8_ >> 0x30) * 0x1000003d1 + auStack_450._0_8_;
      if (((uVar18 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar18 & 0xfffffffffffff) == 0)) {
        uVar10 = (uVar18 >> 0x34) + auStack_450._8_8_;
        uVar14 = (uVar10 >> 0x34) + auStack_450._16_8_;
        uVar19 = (uVar14 >> 0x34) + auStack_450._24_8_;
        uVar22 = (uVar19 >> 0x34) + (auStack_450._32_8_ & 0xffffffffffff);
        if ((((uVar10 | uVar18 | uVar14 | uVar19) & 0xfffffffffffff) != 0 || uVar22 != 0) &&
           ((uVar18 + 0x1000003d0 & uVar10 & uVar14 & uVar19 & (uVar22 ^ 0xf000000000000)) !=
            0xfffffffffffff)) goto LAB_00156063;
        pcStack_4c8 = (code *)0x155f92;
        secp256k1_fe_verify((secp256k1_fe *)r_04);
        uVar18 = (uStack_3f0 >> 0x30) * 0x1000003d1 + auStack_450._64_8_;
        if (((uVar18 & 0xfffffffffffff) != 0xffffefffffc2f) && ((uVar18 & 0xfffffffffffff) != 0))
        goto LAB_00156063;
        uVar10 = (uVar18 >> 0x34) + uStack_408;
        psVar13 = (secp256k1_ge *)((uVar10 >> 0x34) + uStack_400);
        a_00 = (secp256k1_ge *)(((ulong)psVar13 >> 0x34) + uStack_3f8);
        uVar14 = ((ulong)a_00 >> 0x34) + (uStack_3f0 & 0xffffffffffff);
        if ((((uVar10 | uVar18 | (ulong)psVar13 | (ulong)a_00) & 0xfffffffffffff) != 0 ||
             uVar14 != 0) &&
           ((uVar18 + 0x1000003d0 & uVar10 & (ulong)psVar13 & (ulong)a_00 &
            (uVar14 ^ 0xf000000000000)) != 0xfffffffffffff)) goto LAB_00156063;
        goto LAB_00156149;
      }
LAB_00156063:
      a_02 = (secp256k1_ge *)(auStack_4b0 + 0x30);
      psVar11 = (secp256k1_ge *)auStack_450;
      pcStack_4c8 = (code *)0x15607b;
      iVar5 = secp256k1_fe_equal((secp256k1_fe *)a_02,(secp256k1_fe *)psVar11);
      r_02 = (secp256k1_ge *)auStack_4b0;
      if (iVar5 != 0) {
        pcStack_4c8 = (code *)0x15608f;
        psVar13 = r_04;
        a_00 = r_02;
        iVar5 = secp256k1_fe_equal((secp256k1_fe *)r_02,(secp256k1_fe *)r_04);
        if (iVar5 == 0) goto LAB_00156097;
        goto LAB_0015613f;
      }
LAB_00156097:
      pcStack_4c8 = (code *)0x1560a5;
      secp256k1_fe_mul((secp256k1_fe *)a_02,(secp256k1_fe *)a_02,(secp256k1_fe *)r_04);
      pcStack_4c8 = (code *)0x1560b3;
      secp256k1_fe_mul((secp256k1_fe *)r_02,(secp256k1_fe *)r_02,(secp256k1_fe *)psVar11);
      pcStack_4c8 = (code *)0x1560be;
      psVar13 = r_02;
      a_00 = a_02;
      iVar5 = secp256k1_fe_equal((secp256k1_fe *)a_02,(secp256k1_fe *)r_02);
      if (iVar5 == 0) goto LAB_0015613a;
      psVar13 = &sStack_2a0;
      psVar11 = &sStack_310;
      for (lVar7 = 0xd; lVar7 != 0; lVar7 = lVar7 + -1) {
        (psVar11->x).n[0] = (psVar13->x).n[0];
        psVar13 = (secp256k1_ge *)((long)psVar13 + ((ulong)bVar28 * -2 + 1) * 8);
        psVar11 = (secp256k1_ge *)((long)psVar11 + ((ulong)bVar28 * -2 + 1) * 8);
      }
      r_01 = (secp256k1_ge *)(((secp256k1_fe *)(auStack_450._56_8_ + 0x30))->n + 2);
      if (r_01 == (secp256k1_ge *)0x80000) {
        return iVar5;
      }
    }
    pcStack_4c8 = (code *)0x156126;
    test_pre_g_table_cold_9();
LAB_00156126:
    pcStack_4c8 = (code *)0x15612b;
    test_pre_g_table_cold_8();
LAB_0015612b:
    pcStack_4c8 = (code *)0x156130;
    test_pre_g_table_cold_7();
LAB_00156130:
    pcStack_4c8 = (code *)0x156135;
    test_pre_g_table_cold_6();
LAB_00156135:
    r_04 = a_01;
    pcStack_4c8 = (code *)0x15613a;
    test_pre_g_table_cold_5();
LAB_0015613a:
    pcStack_4c8 = (code *)0x15613f;
    test_pre_g_table_cold_4();
LAB_0015613f:
    pcStack_4c8 = (code *)0x156144;
    test_pre_g_table_cold_3();
    r_03 = r_04;
    r_04 = a_02;
LAB_00156144:
    pcStack_4c8 = (code *)0x156149;
    test_pre_g_table_cold_1();
LAB_00156149:
    pcStack_4c8 = (code *)0x15614e;
    test_pre_g_table_cold_2();
  }
  pcStack_4c8 = test_fixed_wnaf_small_helper;
  test_pre_g_table_cold_10();
  pcStack_4c8 = (code *)extraout_RAX;
  uVar18 = 0x20;
  do {
    uVar4 = (int)uVar18 - 1;
    uVar18 = (ulong)uVar4;
    if (*(int *)((long)(a_00->x).n + uVar18 * 4) != 0) {
      psStack_4d0 = (secp256k1_ge *)0x156181;
      test_fixed_wnaf_small_helper_cold_1();
      goto LAB_00156181;
    }
  } while (8 < uVar4);
  uVar4 = 7;
  while (*(int *)((long)(a_00->x).n + (ulong)uVar4 * 4) ==
         *(int *)((long)(psVar13->x).n + (ulong)uVar4 * 4)) {
    bVar27 = uVar4 == 0;
    uVar4 = uVar4 - 1;
    if (bVar27) {
      return (int)extraout_RAX;
    }
  }
LAB_00156181:
  psStack_4d0 = (secp256k1_ge *)test_ecmult_target;
  test_fixed_wnaf_small_helper_cold_2();
  psVar17 = (secp256k1_gej *)auStack_10f0;
  psVar12 = (secp256k1_strauss_point_state *)((ulong)psVar13 & 0xffffffff);
  psVar25 = (secp256k1_scalar *)auStack_10d0;
  psStack_10f8 = (secp256k1_strauss_point_state *)0x1561a9;
  psStack_4f8 = r_01;
  psStack_4f0 = psVar24;
  psStack_4e8 = r_02;
  psStack_4e0 = r_03;
  psStack_4d8 = r_04;
  psStack_4d0 = psVar11;
  testutil_random_scalar_order_test(psVar25);
  psStack_10f8 = (secp256k1_strauss_point_state *)0x1561ba;
  secp256k1_scalar_add((secp256k1_scalar *)auStack_10f0,psVar25,(secp256k1_scalar *)a_00);
  psStack_10f8 = (secp256k1_strauss_point_state *)0x1561c5;
  secp256k1_scalar_negate((secp256k1_scalar *)auStack_10f0,(secp256k1_scalar *)auStack_10f0);
  if ((int)psVar13 == 0) {
    psStack_10f8 = (secp256k1_strauss_point_state *)0x1562be;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_f68,(secp256k1_scalar *)auStack_10d0);
    psStack_10f8 = (secp256k1_strauss_point_state *)0x1562d5;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_1000,(secp256k1_scalar *)auStack_10f0);
    psStack_10f8 = (secp256k1_strauss_point_state *)0x1562e9;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_1098,(secp256k1_scalar *)a_00);
  }
  else {
    psStack_10f8 = (secp256k1_strauss_point_state *)0x1561dd;
    testutil_random_ge_test(&sStack_ed0);
    psStack_10f8 = (secp256k1_strauss_point_state *)0x1561ed;
    secp256k1_gej_set_ge(&sStack_e68,&sStack_ed0);
    if ((int)psVar13 == 1) {
      psVar24 = asStack_dd0;
      r_02 = asStack_c50;
      psVar12 = &sStack_910;
      psVar25 = &secp256k1_scalar_zero;
      psStack_10f8 = (secp256k1_strauss_point_state *)0x15624d;
      sStack_1000.x.n[0] = (uint64_t)psVar24;
      sStack_1000.x.n[1] = (uint64_t)r_02;
      sStack_1000.x.n[2] = (uint64_t)psVar12;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_1000,&sStack_f68,1,&sStack_e68,
                 (secp256k1_scalar *)auStack_10d0,&secp256k1_scalar_zero);
      psStack_10f8 = (secp256k1_strauss_point_state *)0x156278;
      sStack_1098.x.n[0] = (uint64_t)psVar24;
      sStack_1098.x.n[1] = (uint64_t)r_02;
      sStack_1098.x.n[2] = (uint64_t)psVar12;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_1098,&sStack_1000,1,&sStack_e68,
                 (secp256k1_scalar *)auStack_10f0,&secp256k1_scalar_zero);
      psStack_10f8 = (secp256k1_strauss_point_state *)0x1562a0;
      auStack_10d0._32_8_ = psVar24;
      psStack_10a8 = r_02;
      psStack_10a0 = psVar12;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)(auStack_10d0 + 0x20),&sStack_1098,1,&sStack_e68,
                 (secp256k1_scalar *)a_00,&secp256k1_scalar_zero);
      psVar17 = &sStack_e68;
    }
    else {
      psVar25 = (secp256k1_scalar *)&sStack_ed0;
      psStack_10f8 = (secp256k1_strauss_point_state *)0x156308;
      secp256k1_ecmult_const(&sStack_f68,(secp256k1_ge *)psVar25,(secp256k1_scalar *)auStack_10d0);
      psStack_10f8 = (secp256k1_strauss_point_state *)0x15631b;
      secp256k1_ecmult_const(&sStack_1000,(secp256k1_ge *)psVar25,(secp256k1_scalar *)auStack_10f0);
      psStack_10f8 = (secp256k1_strauss_point_state *)0x15632b;
      secp256k1_ecmult_const(&sStack_1098,(secp256k1_ge *)psVar25,(secp256k1_scalar *)a_00);
      psVar17 = (secp256k1_gej *)auStack_10f0;
    }
  }
  psStack_10f8 = (secp256k1_strauss_point_state *)0x156345;
  secp256k1_gej_add_var(&sStack_1098,&sStack_1098,&sStack_f68,(secp256k1_fe *)0x0);
  psStack_10f8 = (secp256k1_strauss_point_state *)0x15635a;
  psVar15 = &sStack_1098;
  secp256k1_gej_add_var(&sStack_1098,&sStack_1098,&sStack_1000,(secp256k1_fe *)0x0);
  psStack_10f8 = (secp256k1_strauss_point_state *)0x156362;
  psVar16 = &sStack_1098;
  secp256k1_gej_verify(&sStack_1098);
  if (sStack_1098.infinity != 0) {
    return extraout_EAX;
  }
  psStack_10f8 = (secp256k1_strauss_point_state *)test_ecmult_constants_sha;
  test_ecmult_target_cold_1();
  out32 = (uchar *)((ulong)psVar16 & 0xffffffff);
  pcStack_1260 = (code *)0x1563b0;
  psStack_1248 = psVar15;
  lStack_1240 = extraout_RDX;
  psStack_1120 = &sStack_1098;
  psStack_1118 = psVar24;
  psStack_1110 = r_02;
  psStack_1108 = (secp256k1_ge *)psVar25;
  psStack_1100 = psVar17;
  psStack_10f8 = psVar12;
  scratch = secp256k1_scratch_space_create(CTX,0x10000);
  uStack_124e = SUB84(psVar16,0);
  acc = &sStack_1188;
  sStack_1188.s[0] = 0x6a09e667;
  sStack_1188.s[1] = 0xbb67ae85;
  sStack_1188.s[2] = 0x3c6ef372;
  sStack_1188.s[3] = 0xa54ff53a;
  sStack_1188.s[4] = 0x510e527f;
  sStack_1188.s[5] = 0x9b05688c;
  sStack_1188.s[6] = 0x1f83d9ab;
  sStack_1188.s[7] = 0x5be0cd19;
  psVar15 = (secp256k1_gej *)0x0;
  sStack_1188.bytes = 0;
  psVar25 = (secp256k1_scalar *)(auStack_1238 + 0x20);
  auStack_1238._32_8_ = 0;
  uStack_1210._0_4_ = 0;
  uStack_1210._4_4_ = 0;
  uStack_1208 = 0;
  uStack_1200 = 0;
  pcStack_1260 = (code *)0x1563fa;
  secp256k1_scalar_verify(psVar25);
  pcStack_1260 = (code *)0x156408;
  test_ecmult_accumulate(acc,psVar25,scratch);
  auStack_1238._32_8_ = 1;
  uStack_1210._0_4_ = 0;
  uStack_1210._4_4_ = 0;
  uStack_1208 = 0;
  uStack_1200 = 0;
  pcStack_1260 = (code *)0x156424;
  secp256k1_scalar_verify(psVar25);
  pcStack_1260 = (code *)0x156432;
  test_ecmult_accumulate(acc,psVar25,scratch);
  pcStack_1260 = (code *)0x15643d;
  secp256k1_scalar_negate(psVar25,psVar25);
  pcStack_1260 = (code *)0x15644e;
  test_ecmult_accumulate(acc,psVar25,scratch);
  psVar17 = psStack_1248;
  if (psStack_1248 != (secp256k1_gej *)0x0) {
    psVar15 = (secp256k1_gej *)0x0;
    acc = &sStack_11f8;
    out32 = auStack_1238;
    do {
      uStack_124a = SUB82(psVar15,0);
      sStack_11f8.s[0] = 0x6a09e667;
      sStack_11f8.s[1] = 0xbb67ae85;
      sStack_11f8.s[2] = 0x3c6ef372;
      sStack_11f8.s[3] = 0xa54ff53a;
      sStack_11f8.s[4] = 0x510e527f;
      sStack_11f8.s[5] = 0x9b05688c;
      sStack_11f8.s[6] = 0x1f83d9ab;
      sStack_11f8.s[7] = 0x5be0cd19;
      sStack_11f8.bytes = 0;
      pcStack_1260 = (code *)0x1564aa;
      secp256k1_sha256_write(acc,(uchar *)&uStack_124e,6);
      pcStack_1260 = (code *)0x1564b5;
      secp256k1_sha256_finalize(acc,out32);
      pcStack_1260 = (code *)0x1564c2;
      secp256k1_scalar_set_b32((secp256k1_scalar *)(auStack_1238 + 0x20),out32,(int *)0x0);
      pcStack_1260 = (code *)0x1564d5;
      test_ecmult_accumulate(&sStack_1188,(secp256k1_scalar *)(auStack_1238 + 0x20),scratch);
      psVar15 = (secp256k1_gej *)((long)(psVar15->x).n + 1);
    } while (psVar17 != psVar15);
  }
  hash = &sStack_1188;
  psVar16 = (secp256k1_gej *)auStack_1238;
  pcStack_1260 = (code *)0x1564ef;
  secp256k1_sha256_finalize(hash,(uchar *)psVar16);
  lVar7 = 0;
  while (auStack_1238[lVar7] == *(char *)(lStack_1240 + lVar7)) {
    lVar7 = lVar7 + 1;
    if (lVar7 == 0x20) {
      pcStack_1260 = (code *)0x156517;
      secp256k1_scratch_space_destroy(CTX,scratch);
      return extraout_EAX_00;
    }
  }
  pcStack_1260 = test_ecmult_accumulate;
  test_ecmult_constants_sha_cold_1();
  psStack_1268 = psVar17;
  auStack_1f10 = (undefined1  [8])0x41;
  psStack_1f28 = (secp256k1_gej *)0x156567;
  psStack_1288 = scratch;
  psStack_1280 = acc;
  puStack_1278 = auStack_1238 + 0x20;
  psStack_1270 = psVar15;
  pcStack_1260 = (code *)out32;
  secp256k1_gej_set_ge(&sStack_1d28,&secp256k1_ge_const_g);
  psStack_1f28 = (secp256k1_gej *)0x156574;
  secp256k1_gej_set_infinity(&sStack_1dc0);
  psStack_1f28 = (secp256k1_gej *)0x15658b;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_1c90 + 1,(secp256k1_scalar *)psVar16);
  psVar12 = (secp256k1_strauss_point_state *)(asStack_19e0[5].y.n + 3);
  psStack_1f28 = (secp256k1_gej *)0x1565dd;
  sStack_1e58.x.n[0] = (uint64_t)asStack_1b60;
  sStack_1e58.x.n[1] = (uint64_t)asStack_19e0;
  sStack_1e58.x.n[2] = (uint64_t)psVar12;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_1e58,&sStack_1c90,1,&sStack_1d28,
             (secp256k1_scalar *)psVar16,&secp256k1_scalar_zero);
  psStack_1f28 = (secp256k1_gej *)0x15660d;
  auStack_1f08._0_8_ = asStack_1b60;
  auStack_1f08._8_8_ = asStack_19e0;
  auStack_1f08._16_8_ = psVar12;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)auStack_1f08,&sStack_1e58,1,&sStack_1dc0,
             &secp256k1_scalar_zero,(secp256k1_scalar *)psVar16);
  error_callback = (secp256k1_callback *)0xd0;
  psVar15 = (secp256k1_gej *)&CTX->error_callback;
  psStack_1f28 = (secp256k1_gej *)0x15663e;
  psVar25 = (secp256k1_scalar *)psVar16;
  psVar17 = scratch_00;
  iVar5 = secp256k1_ecmult_multi_var
                    ((secp256k1_callback *)psVar15,(secp256k1_scratch *)scratch_00,
                     (secp256k1_gej *)(asStack_19e0[5].y.n + 3),(secp256k1_scalar *)psVar16,
                     (secp256k1_ecmult_multi_callback *)0x0,(void *)0x0,0);
  if (iVar5 == 0) {
    psStack_1f28 = (secp256k1_gej *)0x1567a3;
    test_ecmult_accumulate_cold_8();
LAB_001567a3:
    psStack_1f28 = (secp256k1_gej *)0x1567a8;
    test_ecmult_accumulate_cold_7();
LAB_001567a8:
    psStack_1f28 = (secp256k1_gej *)0x1567ad;
    test_ecmult_accumulate_cold_6();
LAB_001567ad:
    psStack_1f28 = (secp256k1_gej *)0x1567b2;
    test_ecmult_accumulate_cold_5();
LAB_001567b2:
    psStack_1f28 = (secp256k1_gej *)0x1567b7;
    test_ecmult_accumulate_cold_4();
LAB_001567b7:
    psStack_1f28 = (secp256k1_gej *)0x1567bc;
    test_ecmult_accumulate_cold_3();
LAB_001567bc:
    psStack_1f28 = (secp256k1_gej *)0x1567c1;
    test_ecmult_accumulate_cold_2();
  }
  else {
    error_callback = &CTX->error_callback;
    psVar25 = &secp256k1_scalar_zero;
    psStack_1f28 = (secp256k1_gej *)0x156679;
    psVar17 = scratch_00;
    psVar15 = (secp256k1_gej *)error_callback;
    iVar5 = secp256k1_ecmult_multi_var
                      (error_callback,(secp256k1_scratch *)scratch_00,asStack_19e0,
                       &secp256k1_scalar_zero,test_ecmult_accumulate_cb,psVar16,1);
    if (iVar5 == 0) goto LAB_001567a3;
    psStack_1f28 = (secp256k1_gej *)0x156698;
    secp256k1_ecmult_const(asStack_1b60,&secp256k1_ge_const_g,(secp256k1_scalar *)psVar16);
    psVar16 = (secp256k1_gej *)auStack_1f08;
    psStack_1f28 = (secp256k1_gej *)0x1566ad;
    secp256k1_ge_set_gej_var((secp256k1_ge *)psVar16,&sStack_1c90 + 1);
    psVar15 = &sStack_1c90;
    psStack_1f28 = (secp256k1_gej *)0x1566bd;
    psVar17 = psVar16;
    iVar5 = secp256k1_gej_eq_ge_var(psVar15,(secp256k1_ge *)psVar16);
    if (iVar5 == 0) goto LAB_001567a8;
    psVar15 = &sStack_1e58;
    psVar17 = (secp256k1_gej *)auStack_1f08;
    psStack_1f28 = (secp256k1_gej *)0x1566d7;
    iVar5 = secp256k1_gej_eq_ge_var(psVar15,(secp256k1_ge *)psVar17);
    if (iVar5 == 0) goto LAB_001567ad;
    psVar15 = (secp256k1_gej *)(asStack_19e0[5].y.n + 3);
    psVar17 = (secp256k1_gej *)auStack_1f08;
    psStack_1f28 = (secp256k1_gej *)0x1566f1;
    iVar5 = secp256k1_gej_eq_ge_var(psVar15,(secp256k1_ge *)psVar17);
    if (iVar5 == 0) goto LAB_001567b2;
    psVar15 = asStack_19e0;
    psVar17 = (secp256k1_gej *)auStack_1f08;
    psStack_1f28 = (secp256k1_gej *)0x15670b;
    iVar5 = secp256k1_gej_eq_ge_var(psVar15,(secp256k1_ge *)psVar17);
    if (iVar5 == 0) goto LAB_001567b7;
    psVar15 = asStack_1b60;
    psVar17 = (secp256k1_gej *)auStack_1f08;
    psStack_1f28 = (secp256k1_gej *)0x156725;
    iVar5 = secp256k1_gej_eq_ge_var(psVar15,(secp256k1_ge *)psVar17);
    if (iVar5 == 0) goto LAB_001567bc;
    psStack_1f28 = (secp256k1_gej *)0x15673a;
    secp256k1_ge_verify((secp256k1_ge *)auStack_1f08);
    if (auStack_1f08._96_4_ != 0) {
      auStack_1f08[0x68] = 0;
      len = 1;
LAB_00156782:
      psStack_1f28 = (secp256k1_gej *)0x15678c;
      secp256k1_sha256_write(hash,auStack_1f08 + 0x68,len);
      return extraout_EAX_01;
    }
    psVar15 = (secp256k1_gej *)auStack_1f08;
    psVar17 = (secp256k1_gej *)(auStack_1f08 + 0x68);
    psVar16 = (secp256k1_gej *)auStack_1f10;
    psVar25 = (secp256k1_scalar *)0x0;
    psStack_1f28 = (secp256k1_gej *)0x15676f;
    secp256k1_eckey_pubkey_serialize((secp256k1_ge *)psVar15,(uchar *)psVar17,(size_t *)psVar16,0);
    if (auStack_1f10 == (undefined1  [8])0x41) {
      len = 0x41;
      goto LAB_00156782;
    }
  }
  psStack_1f28 = (secp256k1_gej *)test_ecmult_accumulate_cb;
  test_ecmult_accumulate_cold_1();
  uVar1 = (((secp256k1_gej *)psVar25)->x).n[0];
  uVar2 = (((secp256k1_gej *)psVar25)->x).n[1];
  uVar3 = (((secp256k1_gej *)psVar25)->x).n[3];
  (psVar15->x).n[2] = (((secp256k1_gej *)psVar25)->x).n[2];
  (psVar15->x).n[3] = uVar3;
  (psVar15->x).n[0] = uVar1;
  (psVar15->x).n[1] = uVar2;
  psVar13 = &secp256k1_ge_const_g;
  psVar15 = psVar17;
  for (lVar7 = 0xd; lVar7 != 0; lVar7 = lVar7 + -1) {
    (psVar15->x).n[0] = (psVar13->x).n[0];
    psVar13 = (secp256k1_ge *)((long)psVar13 + (ulong)bVar28 * -0x10 + 8);
    psVar15 = (secp256k1_gej *)((long)psVar15 + (ulong)bVar28 * -0x10 + 8);
  }
  if (extraout_RDX_00 == 0) {
    return 1;
  }
  psStack_1f30 = (secp256k1_scalar *)test_ecmult_multi;
  psStack_1f28 = psVar17;
  test_ecmult_accumulate_cb_cold_1();
  psStack_1f30 = &secp256k1_scalar_zero;
  psStack_3e08 = &sStack_3b10;
  cbdata = &psStack_3e08;
  psStack_3e00 = &sStack_2c60;
  psVar20 = (secp256k1_strauss_point_state *)&CTX->error_callback;
  cb = ecmult_multi_callback;
  psVar25 = (secp256k1_scalar *)0x0;
  psVar17 = psVar15;
  psStack_1f58 = asStack_1b60;
  psStack_1f50 = error_callback;
  psStack_1f40 = psVar16;
  psStack_1f38 = psVar12;
  iVar5 = (*(code *)psVar13)(psVar20,psVar15,auStack_3cd8);
  if (iVar5 == 0) goto LAB_00157831;
  if (0 < COUNT) {
    uVar4 = 0;
    do {
      ppsVar23 = &psStack_3e08;
      testutil_random_scalar_order(&sStack_3b10);
      testutil_random_scalar_order(&sStack_3af0);
      testutil_random_ge_test((secp256k1_ge *)&sStack_3638);
      secp256k1_gej_set_ge(&sStack_3c40,(secp256k1_ge *)&sStack_3638);
      sStack_3d70.x.n[2] = (uint64_t)&sStack_3070;
      psVar16 = &sStack_3710;
      psVar17 = &sStack_3638;
      psVar11 = &sStack_2c60;
      for (lVar7 = 0xd; lVar7 != 0; lVar7 = lVar7 + -1) {
        (psVar11->x).n[0] = (psVar17->x).n[0];
        psVar17 = (secp256k1_gej *)((long)psVar17 + (ulong)bVar28 * -0x10 + 8);
        psVar11 = (secp256k1_ge *)((long)psVar11 + ((ulong)bVar28 * -2 + 1) * 8);
      }
      psVar11 = &secp256k1_ge_const_g;
      psVar24 = asStack_2bf8;
      for (lVar7 = 0xd; lVar7 != 0; lVar7 = lVar7 + -1) {
        (psVar24->x).n[0] = (psVar11->x).n[0];
        psVar11 = (secp256k1_ge *)((long)psVar11 + ((ulong)bVar28 * -2 + 1) * 8);
        psVar24 = (secp256k1_ge *)((long)psVar24 + ((ulong)bVar28 * -2 + 1) * 8);
      }
      sStack_3d70.x.n[0] = (uint64_t)asStack_35a0;
      sStack_3d70.x.n[1] = (uint64_t)asStack_3420;
      psVar8 = &sStack_3b10;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_3d70,psVar16,1,&sStack_3c40,
                 &secp256k1_scalar_zero,psVar8);
      psVar20 = (secp256k1_strauss_point_state *)&CTX->error_callback;
      cb = ecmult_multi_callback;
      psVar17 = psVar15;
      iVar5 = (*(code *)psVar13)(psVar20,psVar15,(secp256k1_strauss_point_state *)auStack_3cd8);
      if (iVar5 == 0) goto LAB_001577f0;
      psVar17 = psVar16;
      psVar20 = (secp256k1_strauss_point_state *)auStack_3cd8;
      iVar5 = secp256k1_gej_eq_var((secp256k1_gej *)auStack_3cd8,psVar16);
      if (iVar5 == 0) goto LAB_001577f5;
      sStack_3d70.x.n[0] = (uint64_t)asStack_35a0;
      sStack_3d70.x.n[1] = (uint64_t)asStack_3420;
      sStack_3d70.x.n[2] = (uint64_t)&sStack_3070;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_3d70,psVar16,1,&sStack_3c40,&sStack_3b10,
                 &secp256k1_scalar_zero);
      psVar20 = (secp256k1_strauss_point_state *)&CTX->error_callback;
      cb = ecmult_multi_callback;
      ppsVar23 = &psStack_3e08;
      psVar8 = &secp256k1_scalar_zero;
      psVar17 = psVar15;
      iVar5 = (*(code *)psVar13)(psVar20,psVar15,(secp256k1_strauss_point_state *)auStack_3cd8);
      if (iVar5 == 0) goto LAB_001577fa;
      psVar20 = (secp256k1_strauss_point_state *)auStack_3cd8;
      iVar5 = secp256k1_gej_eq_var((secp256k1_gej *)auStack_3cd8,psVar16);
      if (iVar5 == 0) goto LAB_001577ff;
      psVar20 = (secp256k1_strauss_point_state *)&CTX->error_callback;
      cb = ecmult_multi_false_callback;
      cbdata = &psStack_3e08;
      psVar8 = &secp256k1_scalar_zero;
      psVar16 = psVar15;
      ppsVar23 = cbdata;
      iVar5 = (*(code *)psVar13)(psVar20,psVar15,(secp256k1_strauss_point_state *)auStack_3cd8);
      if (iVar5 != 0) goto LAB_00157804;
      sStack_3d70.x.n[0] = (uint64_t)asStack_35a0;
      sStack_3d70.x.n[1] = (uint64_t)asStack_3420;
      sStack_3d70.x.n[2] = (uint64_t)&sStack_3070;
      psVar17 = &sStack_3710;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_3d70,psVar17,1,&sStack_3c40,&sStack_3b10,
                 &sStack_3af0);
      psVar20 = (secp256k1_strauss_point_state *)&CTX->error_callback;
      cb = ecmult_multi_callback;
      psVar8 = &secp256k1_scalar_zero;
      psVar16 = psVar15;
      iVar5 = (*(code *)psVar13)(psVar20,psVar15,(secp256k1_strauss_point_state *)auStack_3cd8);
      if (iVar5 == 0) goto LAB_00157809;
      psVar16 = psVar17;
      psVar20 = (secp256k1_strauss_point_state *)auStack_3cd8;
      iVar5 = secp256k1_gej_eq_var((secp256k1_gej *)auStack_3cd8,psVar17);
      if (iVar5 == 0) goto LAB_0015780e;
      sStack_3d70.x.n[0] = (uint64_t)asStack_35a0;
      sStack_3d70.x.n[1] = (uint64_t)asStack_3420;
      sStack_3d70.x.n[2] = (uint64_t)&sStack_3070;
      psVar8 = &sStack_3af0;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_3d70,psVar17,1,&sStack_3c40,&sStack_3b10,psVar8)
      ;
      psVar20 = (secp256k1_strauss_point_state *)&CTX->error_callback;
      cbdata = &psStack_3e08;
      cb = ecmult_multi_callback;
      psVar16 = psVar15;
      iVar5 = (*(code *)psVar13)(psVar20,psVar15,(secp256k1_strauss_point_state *)auStack_3cd8);
      if (iVar5 == 0) goto LAB_00157813;
      psVar20 = (secp256k1_strauss_point_state *)auStack_3cd8;
      iVar5 = secp256k1_gej_eq_var((secp256k1_gej *)auStack_3cd8,psVar17);
      psVar8 = (secp256k1_scalar *)(ulong)uVar4;
      if (iVar5 == 0) goto LAB_00157818;
      uVar4 = uVar4 + 1;
    } while ((int)uVar4 < COUNT);
    if (0 < COUNT) {
      uVar4 = 0;
      do {
        psVar25 = (secp256k1_scalar *)(ulong)uVar4;
        lVar7 = 0;
        do {
          psVar11 = &sStack_2c60;
          lVar26 = 0;
          do {
            testutil_random_scalar_order((secp256k1_scalar *)((long)sStack_3b10.d + lVar26));
            secp256k1_ge_set_infinity(psVar11);
            lVar26 = lVar26 + 0x20;
            psVar11 = psVar11 + 1;
          } while (lVar26 != 0x400);
          psVar20 = (secp256k1_strauss_point_state *)&CTX->error_callback;
          psVar8 = &secp256k1_scalar_zero;
          cb = ecmult_multi_callback;
          ppsVar23 = &psStack_3e08;
          psVar17 = psVar15;
          iVar5 = (*(code *)psVar13)(psVar20,psVar15,(secp256k1_strauss_point_state *)auStack_3cd8);
          if (iVar5 == 0) goto LAB_001577c8;
          psVar20 = (secp256k1_strauss_point_state *)auStack_3cd8;
          secp256k1_gej_verify((secp256k1_gej *)auStack_3cd8);
          if (auStack_3cd8._144_4_ == 0) goto LAB_001577cd;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        lVar7 = 0;
        do {
          psVar8 = &sStack_3b10;
          lVar26 = 0;
          do {
            testutil_random_ge_test((secp256k1_ge *)&sStack_3070);
            psVar12 = &sStack_3070;
            puVar21 = (uint64_t *)((long)sStack_2c60.x.n + lVar26);
            for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
              *puVar21 = ((secp256k1_fe *)psVar12->wnaf_na_1)->n[0];
              psVar12 = (secp256k1_strauss_point_state *)((long)psVar12 + (ulong)bVar28 * -0x10 + 8)
              ;
              puVar21 = puVar21 + (ulong)bVar28 * -2 + 1;
            }
            psVar8->d[2] = 0;
            psVar8->d[3] = 0;
            psVar8->d[0] = 0;
            psVar8->d[1] = 0;
            secp256k1_scalar_verify(psVar8);
            lVar26 = lVar26 + 0x68;
            psVar8 = psVar8 + 1;
          } while (lVar26 != 0xd00);
          psVar20 = (secp256k1_strauss_point_state *)&CTX->error_callback;
          psVar8 = &secp256k1_scalar_zero;
          cb = ecmult_multi_callback;
          ppsVar23 = &psStack_3e08;
          psVar17 = psVar15;
          iVar5 = (*(code *)psVar13)(psVar20,psVar15,(secp256k1_strauss_point_state *)auStack_3cd8);
          if (iVar5 == 0) goto LAB_001577d2;
          psVar20 = (secp256k1_strauss_point_state *)auStack_3cd8;
          secp256k1_gej_verify((secp256k1_gej *)auStack_3cd8);
          if (auStack_3cd8._144_4_ == 0) goto LAB_001577d7;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        lVar7 = 0;
        do {
          testutil_random_ge_test((secp256k1_ge *)&sStack_3070);
          lVar26 = 0x68;
          psVar8 = &sStack_3b10;
          do {
            testutil_random_scalar_order(psVar8);
            secp256k1_scalar_negate(psVar8 + 1,psVar8);
            psVar12 = &sStack_3070;
            puVar21 = (uint64_t *)((long)(&sStack_2c60)[-1].x.n + lVar26);
            for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
              *puVar21 = ((secp256k1_fe *)psVar12->wnaf_na_1)->n[0];
              psVar12 = (secp256k1_strauss_point_state *)((long)psVar12 + (ulong)bVar28 * -0x10 + 8)
              ;
              puVar21 = puVar21 + (ulong)bVar28 * -2 + 1;
            }
            psVar12 = &sStack_3070;
            puVar21 = (uint64_t *)((long)sStack_2c60.x.n + lVar26);
            for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
              *puVar21 = ((secp256k1_fe *)psVar12->wnaf_na_1)->n[0];
              psVar12 = (secp256k1_strauss_point_state *)((long)psVar12 + (ulong)bVar28 * -0x10 + 8)
              ;
              puVar21 = puVar21 + (ulong)bVar28 * -2 + 1;
            }
            lVar26 = lVar26 + 0xd0;
            psVar8 = psVar8 + 2;
          } while (lVar26 != 0xd68);
          psVar20 = (secp256k1_strauss_point_state *)&CTX->error_callback;
          psVar8 = &secp256k1_scalar_zero;
          cb = ecmult_multi_callback;
          ppsVar23 = &psStack_3e08;
          psVar17 = psVar15;
          iVar5 = (*(code *)psVar13)(psVar20,psVar15,(secp256k1_strauss_point_state *)auStack_3cd8);
          if (iVar5 == 0) goto LAB_001577dc;
          psVar20 = (secp256k1_strauss_point_state *)auStack_3cd8;
          secp256k1_gej_verify((secp256k1_gej *)auStack_3cd8);
          if (auStack_3cd8._144_4_ == 0) goto LAB_001577e1;
          testutil_random_scalar_order(&sStack_3b10);
          lVar26 = 0x20;
          psVar11 = &sStack_2c60;
          do {
            testutil_random_ge_test((secp256k1_ge *)&sStack_3070);
            uVar2 = sStack_3b10.d[3];
            uVar1 = sStack_3b10.d[1];
            *(uint64_t *)((long)sStack_3ba8.z.n + lVar26 + 0x28) = sStack_3b10.d[2];
            *(uint64_t *)((long)(&sStack_3ba8.z + 1) + lVar26) = uVar2;
            *(uint64_t *)((long)sStack_3ba8.z.n + lVar26 + 0x18) = sStack_3b10.d[0];
            *(uint64_t *)((long)sStack_3ba8.z.n + lVar26 + 0x20) = uVar1;
            *(uint64_t *)((long)sStack_3b10.d + lVar26) = sStack_3b10.d[0];
            *(uint64_t *)((long)sStack_3b10.d + lVar26 + 8) = sStack_3b10.d[1];
            *(uint64_t *)((long)sStack_3b10.d + lVar26 + 0x10) = sStack_3b10.d[2];
            *(uint64_t *)((long)sStack_3b10.d + lVar26 + 0x18) = sStack_3b10.d[3];
            psVar12 = &sStack_3070;
            psVar24 = psVar11;
            for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
              (psVar24->x).n[0] = ((secp256k1_fe *)psVar12->wnaf_na_1)->n[0];
              psVar12 = (secp256k1_strauss_point_state *)((long)psVar12 + (ulong)bVar28 * -0x10 + 8)
              ;
              psVar24 = (secp256k1_ge *)((long)psVar24 + (ulong)bVar28 * -0x10 + 8);
            }
            secp256k1_ge_neg(psVar11 + 1,psVar11);
            lVar26 = lVar26 + 0x40;
            psVar11 = psVar11 + 2;
          } while (lVar26 != 0x420);
          psVar20 = (secp256k1_strauss_point_state *)&CTX->error_callback;
          psVar8 = &secp256k1_scalar_zero;
          cb = ecmult_multi_callback;
          ppsVar23 = &psStack_3e08;
          psVar17 = psVar15;
          iVar5 = (*(code *)psVar13)(psVar20,psVar15,(secp256k1_strauss_point_state *)auStack_3cd8);
          if (iVar5 == 0) goto LAB_001577e6;
          psVar20 = (secp256k1_strauss_point_state *)auStack_3cd8;
          secp256k1_gej_verify((secp256k1_gej *)auStack_3cd8);
          if (auStack_3cd8._144_4_ == 0) goto LAB_001577eb;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        testutil_random_ge_test((secp256k1_ge *)&sStack_3070);
        sStack_3b10.d[2] = 0;
        sStack_3b10.d[3] = 0;
        sStack_3b10.d[0] = 0;
        sStack_3b10.d[1] = 0;
        secp256k1_scalar_verify(&sStack_3b10);
        psVar12 = &sStack_3070;
        psVar11 = &sStack_2c60;
        for (lVar7 = 0xd; lVar7 != 0; lVar7 = lVar7 + -1) {
          (psVar11->x).n[0] = ((secp256k1_fe *)psVar12->wnaf_na_1)->n[0];
          psVar12 = (secp256k1_strauss_point_state *)((long)psVar12 + (ulong)bVar28 * -0x10 + 8);
          psVar11 = (secp256k1_ge *)((long)psVar11 + ((ulong)bVar28 * -2 + 1) * 8);
        }
        lVar7 = 0x68;
        psVar8 = &sStack_3af0;
        do {
          psVar12 = &sStack_3070;
          puVar21 = (uint64_t *)((long)sStack_2c60.x.n + lVar7);
          for (lVar26 = 0xd; lVar26 != 0; lVar26 = lVar26 + -1) {
            *puVar21 = ((secp256k1_fe *)psVar12->wnaf_na_1)->n[0];
            psVar12 = (secp256k1_strauss_point_state *)((long)psVar12 + (ulong)bVar28 * -0x10 + 8);
            puVar21 = puVar21 + (ulong)bVar28 * -2 + 1;
          }
          testutil_random_scalar_order(psVar8);
          secp256k1_scalar_add(&sStack_3b10,&sStack_3b10,psVar8);
          secp256k1_scalar_negate(psVar8,psVar8);
          lVar7 = lVar7 + 0x68;
          psVar8 = psVar8 + 1;
        } while (lVar7 != 0xd00);
        psVar20 = (secp256k1_strauss_point_state *)&CTX->error_callback;
        psVar8 = &secp256k1_scalar_zero;
        cb = ecmult_multi_callback;
        cbdata = &psStack_3e08;
        psVar17 = psVar15;
        iVar5 = (*(code *)psVar13)(psVar20,psVar15,(secp256k1_strauss_point_state *)auStack_3cd8);
        if (iVar5 == 0) goto LAB_0015781d;
        psVar20 = (secp256k1_strauss_point_state *)auStack_3cd8;
        secp256k1_gej_verify((secp256k1_gej *)auStack_3cd8);
        if (auStack_3cd8._144_4_ == 0) goto LAB_00157822;
        uVar4 = uVar4 + 1;
      } while ((int)uVar4 < COUNT);
      if (0 < COUNT) {
        iVar5 = 0;
        do {
          secp256k1_gej_set_infinity((secp256k1_gej *)auStack_3cd8);
          testutil_random_scalar_order(&sStack_3b10);
          psVar11 = &sStack_2c60;
          lVar7 = 0;
          do {
            uVar3 = sStack_3b10.d[3];
            uVar2 = sStack_3b10.d[2];
            uVar1 = sStack_3b10.d[1];
            *(uint64_t *)((long)sStack_3b10.d + lVar7) = sStack_3b10.d[0];
            *(uint64_t *)((long)sStack_3b10.d + lVar7 + 8) = uVar1;
            *(uint64_t *)((long)sStack_3b10.d + lVar7 + 0x10) = uVar2;
            *(uint64_t *)((long)sStack_3b10.d + lVar7 + 0x18) = uVar3;
            testutil_random_ge_test((secp256k1_ge *)&sStack_3070);
            psVar12 = &sStack_3070;
            psVar24 = psVar11;
            for (lVar26 = 0xd; lVar26 != 0; lVar26 = lVar26 + -1) {
              (psVar24->x).n[0] = ((secp256k1_fe *)psVar12->wnaf_na_1)->n[0];
              psVar12 = (secp256k1_strauss_point_state *)((long)psVar12 + (ulong)bVar28 * -0x10 + 8)
              ;
              psVar24 = (secp256k1_ge *)((long)psVar24 + (ulong)bVar28 * -0x10 + 8);
            }
            secp256k1_gej_add_ge_var
                      ((secp256k1_gej *)auStack_3cd8,(secp256k1_gej *)auStack_3cd8,psVar11,
                       (secp256k1_fe *)0x0);
            lVar7 = lVar7 + 0x20;
            psVar11 = psVar11 + 1;
          } while (lVar7 != 0x280);
          sStack_3c40.x.n[0] = (uint64_t)asStack_35a0;
          sStack_3c40.x.n[1] = (uint64_t)asStack_3420;
          sStack_3c40.x.n[2] = (uint64_t)&sStack_3070;
          secp256k1_ecmult_strauss_wnaf
                    ((secp256k1_strauss_state *)&sStack_3c40,&sStack_3710,1,
                     (secp256k1_gej *)auStack_3cd8,&sStack_3b10,&secp256k1_scalar_zero);
          psVar20 = (secp256k1_strauss_point_state *)&CTX->error_callback;
          psVar25 = &secp256k1_scalar_zero;
          cb = ecmult_multi_callback;
          cbdata = &psStack_3e08;
          psVar17 = psVar15;
          iVar6 = (*(code *)psVar13)(psVar20,psVar15,(secp256k1_strauss_point_state *)auStack_3cd8);
          if (iVar6 == 0) goto LAB_00157827;
          psVar17 = &sStack_3710;
          psVar20 = (secp256k1_strauss_point_state *)auStack_3cd8;
          iVar6 = secp256k1_gej_eq_var((secp256k1_gej *)auStack_3cd8,&sStack_3710);
          if (iVar6 == 0) goto LAB_0015782c;
          iVar5 = iVar5 + 1;
        } while (iVar5 < COUNT);
        if (0 < COUNT) {
          iVar5 = 0;
          do {
            sStack_3d70.x.n[2] = 0;
            sStack_3d70.x.n[3] = 0;
            sStack_3d70.x.n[0] = 0;
            sStack_3d70.x.n[1] = 0;
            secp256k1_scalar_verify((secp256k1_scalar *)&sStack_3d70);
            testutil_random_ge_test((secp256k1_ge *)&sStack_3638);
            psVar25 = &sStack_3b10;
            lVar7 = 0;
            do {
              testutil_random_scalar_order(psVar25);
              psVar17 = &sStack_3638;
              puVar21 = (uint64_t *)((long)sStack_2c60.x.n + lVar7);
              for (lVar26 = 0xd; lVar26 != 0; lVar26 = lVar26 + -1) {
                *puVar21 = (psVar17->x).n[0];
                psVar17 = (secp256k1_gej *)((long)psVar17 + (ulong)bVar28 * -0x10 + 8);
                puVar21 = puVar21 + (ulong)bVar28 * -2 + 1;
              }
              secp256k1_scalar_add
                        ((secp256k1_scalar *)&sStack_3d70,(secp256k1_scalar *)&sStack_3d70,psVar25);
              lVar7 = lVar7 + 0x68;
              psVar25 = psVar25 + 1;
            } while (lVar7 != 0x820);
            secp256k1_gej_set_ge(&sStack_3c40,&sStack_2c60);
            sStack_3ba8.x.n[0] = (uint64_t)asStack_35a0;
            sStack_3ba8.x.n[1] = (uint64_t)asStack_3420;
            sStack_3ba8.x.n[2] = (uint64_t)&sStack_3070;
            secp256k1_ecmult_strauss_wnaf
                      ((secp256k1_strauss_state *)&sStack_3ba8,&sStack_3710,1,&sStack_3c40,
                       (secp256k1_scalar *)&sStack_3d70,&secp256k1_scalar_zero);
            psVar20 = (secp256k1_strauss_point_state *)&CTX->error_callback;
            psVar12 = (secp256k1_strauss_point_state *)auStack_3cd8;
            psVar25 = &secp256k1_scalar_zero;
            cb = ecmult_multi_callback;
            cbdata = &psStack_3e08;
            psVar17 = psVar15;
            iVar6 = (*(code *)psVar13)(psVar20,psVar15,psVar12);
            if (iVar6 == 0) goto LAB_00157836;
            psVar17 = &sStack_3710;
            iVar6 = secp256k1_gej_eq_var((secp256k1_gej *)psVar12,psVar17);
            if (iVar6 == 0) goto LAB_0015783b;
            iVar5 = iVar5 + 1;
          } while (iVar5 < COUNT);
        }
      }
    }
  }
  lVar7 = 0;
  psVar11 = &sStack_2c60;
  do {
    testutil_random_scalar_order((secp256k1_scalar *)((long)sStack_3b10.d + lVar7));
    testutil_random_ge_test(psVar11);
    psVar11 = psVar11 + 1;
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0x280);
  sStack_3b10.d[2] = 0;
  sStack_3b10.d[3] = 0;
  sStack_3b10.d[0] = 0;
  sStack_3b10.d[1] = 0;
  secp256k1_scalar_verify(&sStack_3b10);
  psVar12 = (secp256k1_strauss_point_state *)&CTX->error_callback;
  psVar25 = &secp256k1_scalar_zero;
  cb = ecmult_multi_callback;
  cbdata = &psStack_3e08;
  psVar17 = psVar15;
  iVar5 = (*(code *)psVar13)(psVar12,psVar15,auStack_3cd8);
  if (iVar5 == 0) goto LAB_00157840;
  sStack_3af0.d[2] = 0;
  sStack_3af0.d[3] = 0;
  sStack_3af0.d[0] = 0;
  sStack_3af0.d[1] = 0;
  secp256k1_scalar_verify(&sStack_3af0);
  sStack_3ad0.d[2] = 0;
  sStack_3ad0.d[3] = 0;
  sStack_3ad0.d[0] = 0;
  sStack_3ad0.d[1] = 0;
  secp256k1_scalar_verify(&sStack_3ad0);
  sStack_3ab0.d[2] = 0;
  sStack_3ab0.d[3] = 0;
  sStack_3ab0.d[0] = 0;
  sStack_3ab0.d[1] = 0;
  secp256k1_scalar_verify(&sStack_3ab0);
  asStack_3a90[0].d[2] = 0;
  asStack_3a90[0].d[3] = 0;
  asStack_3a90[0].d[0] = 0;
  asStack_3a90[0].d[1] = 0;
  secp256k1_scalar_verify(asStack_3a90);
  psVar12 = (secp256k1_strauss_point_state *)&CTX->error_callback;
  psVar25 = &secp256k1_scalar_zero;
  cb = ecmult_multi_callback;
  cbdata = &psStack_3e08;
  psVar17 = psVar15;
  iVar5 = (*(code *)psVar13)(psVar12,psVar15,auStack_3cd8);
  if (iVar5 == 0) goto LAB_00157845;
  psVar12 = (secp256k1_strauss_point_state *)&CTX->error_callback;
  psVar25 = &secp256k1_scalar_zero;
  cb = ecmult_multi_callback;
  cbdata = &psStack_3e08;
  psVar17 = psVar15;
  iVar5 = (*(code *)psVar13)(psVar12,psVar15,auStack_3cd8);
  if (iVar5 != 0) {
    psVar12 = (secp256k1_strauss_point_state *)auStack_3cd8;
    secp256k1_gej_verify((secp256k1_gej *)psVar12);
    if (auStack_3cd8._144_4_ != 0) {
      testutil_random_ge_test(&sStack_30d8);
      secp256k1_gej_set_ge(&sStack_3c40,&sStack_30d8);
      uStack_3df8 = 0;
      do {
        uStack_3df0 = uStack_3df8 + 1 >> 1;
        uStack_3de8 = (ulong)((uint)uStack_3df8 & 1);
        uVar18 = 0;
        uStack_3df8 = uStack_3df8 + 1;
        do {
          uVar10 = uStack_3de8;
          sStack_3da8.d[3] = 0;
          sStack_3da8.d[1] = 0;
          sStack_3da8.d[2] = 0;
          sStack_3da8.d[0] = uStack_3df0;
          secp256k1_scalar_verify(&sStack_3da8);
          secp256k1_scalar_cond_negate(&sStack_3da8,(int)uVar10);
          uStack_3de0 = uVar18 + 1;
          sStack_3dc8.d[0] = uStack_3de0 >> 1;
          sStack_3dc8.d[1] = 0;
          sStack_3dc8.d[2] = 0;
          sStack_3dc8.d[3] = 0;
          secp256k1_scalar_verify(&sStack_3dc8);
          secp256k1_scalar_cond_negate(&sStack_3dc8,(uint)uVar18 & 1);
          sStack_3d70.x.n[0] = (uint64_t)asStack_35a0;
          sStack_3d70.x.n[1] = (uint64_t)asStack_3420;
          sStack_3d70.x.n[2] = (uint64_t)&sStack_3070;
          secp256k1_ecmult_strauss_wnaf
                    ((secp256k1_strauss_state *)&sStack_3d70,&sStack_3638,1,&sStack_3c40,
                     &sStack_3da8,&secp256k1_scalar_zero);
          sStack_3ba8.x.n[0] = (uint64_t)asStack_35a0;
          sStack_3ba8.x.n[1] = (uint64_t)asStack_3420;
          sStack_3ba8.x.n[2] = (uint64_t)&sStack_3070;
          secp256k1_ecmult_strauss_wnaf
                    ((secp256k1_strauss_state *)&sStack_3ba8,&sStack_3d70,1,&sStack_3c40,
                     &sStack_3dc8,&secp256k1_scalar_zero);
          uStack_3dd8 = 0;
          do {
            uStack_3dd0 = uStack_3dd8 + 1 >> 1;
            uVar4 = (uint)uStack_3dd8;
            uVar18 = 0;
            uStack_3dd8 = uStack_3dd8 + 1;
            do {
              secp256k1_ge_set_gej(&sStack_2c60,&sStack_3638);
              secp256k1_ge_set_gej(asStack_2bf8,&sStack_3d70);
              sStack_3b10.d[0] = uStack_3dd0;
              sStack_3b10.d[3] = 0;
              sStack_3b10.d[1] = 0;
              sStack_3b10.d[2] = 0;
              secp256k1_scalar_verify(&sStack_3b10);
              secp256k1_scalar_cond_negate(&sStack_3b10,uVar4 & 1);
              uVar10 = uVar18 + 1;
              sStack_3af0.d[0] = uVar10 >> 1;
              sStack_3af0.d[1] = 0;
              sStack_3af0.d[2] = 0;
              sStack_3af0.d[3] = 0;
              secp256k1_scalar_verify(&sStack_3af0);
              psVar16 = &sStack_3ba8;
              secp256k1_scalar_cond_negate(&sStack_3af0,(uint)uVar18 & 1);
              secp256k1_scalar_mul(&sStack_3658,&sStack_3da8,&sStack_3b10);
              secp256k1_scalar_mul(&sStack_3678,&sStack_3dc8,&sStack_3af0);
              secp256k1_scalar_add(&sStack_3658,&sStack_3658,&sStack_3678);
              sStack_3d88.aux = asStack_35a0;
              sStack_3d88.pre_a = asStack_3420;
              psVar12 = &sStack_3070;
              sStack_3d88.ps = psVar12;
              secp256k1_ecmult_strauss_wnaf
                        (&sStack_3d88,psVar16,1,&sStack_3c40,&sStack_3658,&secp256k1_scalar_zero);
              psVar20 = (secp256k1_strauss_point_state *)&CTX->error_callback;
              psVar8 = &secp256k1_scalar_zero;
              cb = ecmult_multi_callback;
              ppsVar23 = &psStack_3e08;
              psVar17 = psVar15;
              iVar5 = (*(code *)psVar13)(psVar20,psVar15,psVar12);
              if (iVar5 == 0) {
                test_ecmult_multi_cold_3();
LAB_001577c3:
                test_ecmult_multi_cold_2();
                goto LAB_001577c8;
              }
              iVar5 = secp256k1_gej_eq_var((secp256k1_gej *)psVar12,psVar16);
              psVar17 = psVar16;
              psVar20 = psVar12;
              if (iVar5 == 0) goto LAB_001577c3;
              uVar18 = uVar10;
            } while (uVar10 != 8);
          } while (uStack_3dd8 != 8);
          uVar18 = uStack_3de0;
        } while (uStack_3de0 != 8);
        if (uStack_3df8 == 8) {
          return (int)&sStack_3da8 + 8;
        }
      } while( true );
    }
    goto LAB_0015784f;
  }
  goto LAB_0015784a;
LAB_001577c8:
  test_ecmult_multi_cold_21();
LAB_001577cd:
  test_ecmult_multi_cold_20();
LAB_001577d2:
  test_ecmult_multi_cold_19();
LAB_001577d7:
  test_ecmult_multi_cold_18();
LAB_001577dc:
  test_ecmult_multi_cold_17();
LAB_001577e1:
  test_ecmult_multi_cold_16();
LAB_001577e6:
  test_ecmult_multi_cold_15();
LAB_001577eb:
  test_ecmult_multi_cold_14();
LAB_001577f0:
  test_ecmult_multi_cold_29();
LAB_001577f5:
  test_ecmult_multi_cold_28();
LAB_001577fa:
  psVar16 = psVar17;
  test_ecmult_multi_cold_27();
LAB_001577ff:
  test_ecmult_multi_cold_26();
LAB_00157804:
  cbdata = ppsVar23;
  test_ecmult_multi_cold_1();
LAB_00157809:
  test_ecmult_multi_cold_25();
LAB_0015780e:
  test_ecmult_multi_cold_24();
LAB_00157813:
  psVar17 = psVar16;
  test_ecmult_multi_cold_23();
LAB_00157818:
  test_ecmult_multi_cold_22();
LAB_0015781d:
  psVar25 = psVar8;
  test_ecmult_multi_cold_13();
LAB_00157822:
  test_ecmult_multi_cold_12();
LAB_00157827:
  test_ecmult_multi_cold_11();
LAB_0015782c:
  test_ecmult_multi_cold_10();
LAB_00157831:
  test_ecmult_multi_cold_30();
LAB_00157836:
  psVar12 = psVar20;
  test_ecmult_multi_cold_9();
LAB_0015783b:
  test_ecmult_multi_cold_8();
LAB_00157840:
  test_ecmult_multi_cold_7();
LAB_00157845:
  test_ecmult_multi_cold_6();
LAB_0015784a:
  test_ecmult_multi_cold_5();
LAB_0015784f:
  test_ecmult_multi_cold_4();
  iVar5 = secp256k1_ecmult_pippenger_batch
                    ((secp256k1_callback *)psVar12,(secp256k1_scratch *)psVar17,r_00,psVar25,cb,
                     cbdata,sStack_3e28,0);
  return iVar5;
}

Assistant:

static int gej_xyz_equals_gej(const secp256k1_gej *a, const secp256k1_gej *b) {
    secp256k1_gej a2;
    secp256k1_gej b2;
    int ret = 1;
    ret &= a->infinity == b->infinity;
    if (ret && !a->infinity) {
        a2 = *a;
        b2 = *b;
        secp256k1_fe_normalize(&a2.x);
        secp256k1_fe_normalize(&a2.y);
        secp256k1_fe_normalize(&a2.z);
        secp256k1_fe_normalize(&b2.x);
        secp256k1_fe_normalize(&b2.y);
        secp256k1_fe_normalize(&b2.z);
        ret &= secp256k1_fe_cmp_var(&a2.x, &b2.x) == 0;
        ret &= secp256k1_fe_cmp_var(&a2.y, &b2.y) == 0;
        ret &= secp256k1_fe_cmp_var(&a2.z, &b2.z) == 0;
    }
    return ret;
}